

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

uint __thiscall
cppforth::Forth::ForthStack<unsigned_int>::getTop(ForthStack<unsigned_int> *this,size_t index)

{
  uint uVar1;
  size_type sVar2;
  AbortException *this_00;
  reference pvVar3;
  size_t index1;
  size_t index_local;
  ForthStack<unsigned_int> *this_local;
  
  uVar1 = this->top;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->stack);
  if (sVar2 <= uVar1 - index) {
    this_00 = (AbortException *)__cxa_allocate_exception(0x10);
    AbortException::AbortException(this_00,"Forth stack overflow");
    __cxa_throw(this_00,&AbortException::typeinfo,AbortException::~AbortException);
  }
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                     (&this->stack,this->top - index);
  return *pvVar3;
}

Assistant:

CellType getTop(size_t index){
				{auto index1 = top - index;
				if ((index1) < 0 || (index1) >= stack.size()){
					throw AbortException("Forth stack overflow");
				}
				}
				return stack.at(top - index);
			}